

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwidgetwindow_p.cpp
# Opt level: O2

void QWidgetWindow::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  char *pcStack_d0;
  QByteArrayView QStack_c8;
  QArrayDataPointer<char16_t> QStack_b8;
  QStringBuilder<QString,_QLatin1String> QStack_98;
  QArrayDataPointer<char16_t> QStack_68;
  QArrayDataPointer<char16_t> QStack_48;
  long lStack_28;
  
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  lStack_28 = *(long *)(in_FS_OFFSET + 0x28);
  QStack_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QStack_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QStack_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QObject::objectName();
  if ((undefined1 *)QStack_48.size == (undefined1 *)0x0) {
    (**(code **)**(undefined8 **)(_o + 0x30))();
    pcStack_d0 = (char *)QMetaObject::className();
    QByteArrayView::QByteArrayView<const_char_*,_true>(&QStack_c8,&pcStack_d0);
    QVar4.m_data = (storage_type *)QStack_c8.m_size;
    QVar4.m_size = (qsizetype)&QStack_b8;
    QString::fromUtf8(QVar4);
    QStack_98.a.d.size = QStack_b8.size;
    QStack_98.a.d.ptr = QStack_b8.ptr;
    QStack_98.a.d.d = QStack_b8.d;
    QStack_b8.d = (Data *)0x0;
    QStack_b8.ptr = (char16_t *)0x0;
    QStack_b8.size = 0;
    QStack_98.b.m_size = 5;
    QStack_98.b.m_data = "Class";
    QStringBuilder<QString,_QLatin1String>::convertTo<QString>((QString *)&QStack_68,&QStack_98);
    qVar3 = QStack_48.size;
    pcVar2 = QStack_48.ptr;
    pDVar1 = QStack_48.d;
    QStack_48.d = QStack_68.d;
    QStack_48.ptr = QStack_68.ptr;
    QStack_68.d = pDVar1;
    QStack_68.ptr = pcVar2;
    QStack_48.size = QStack_68.size;
    QStack_68.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&QStack_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_b8);
  }
  QString::append((QLatin1String *)&QStack_48);
  QObject::doSetObjectName((QString *)_o);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWidgetWindow *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->updateObjectName(); break;
        default: ;
        }
    }
    (void)_a;
}